

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

size_t units::findOperatorSep(string *ustring,string *operators)

{
  char cVar1;
  ulong uVar2;
  int index;
  int local_1c;
  
  std::__cxx11::string::append((char *)operators);
  uVar2 = std::__cxx11::string::find_last_of
                    ((char *)ustring,(ulong)(operators->_M_dataplus)._M_p,0xffffffffffffffff);
  if (uVar2 - 1 < 0xfffffffffffffffe) {
    do {
      cVar1 = (ustring->_M_dataplus)._M_p[uVar2];
      if (((cVar1 != ')') && (cVar1 != '}')) && (cVar1 != ']')) break;
      local_1c = (int)uVar2 + -1;
      cVar1 = getMatchCharacter(cVar1);
      segmentcheckReverse(ustring,cVar1,&local_1c);
      if ((long)local_1c < 1) {
        uVar2 = 0xffffffffffffffff;
      }
      else {
        uVar2 = std::__cxx11::string::find_last_of
                          ((char *)ustring,(ulong)(operators->_M_dataplus)._M_p,(long)local_1c);
      }
    } while (uVar2 - 1 < 0xfffffffffffffffe);
  }
  return -(ulong)(uVar2 == 0) | uVar2;
}

Assistant:

static size_t findOperatorSep(const std::string& ustring, std::string operators)
{
    operators.append(")}]");
    auto sep = ustring.find_last_of(operators);

    while (
        sep != std::string::npos && sep > 0 &&
        (ustring[sep] == ')' || ustring[sep] == '}' || ustring[sep] == ']')) {
        int index = static_cast<int>(sep) - 1;
        segmentcheckReverse(ustring, getMatchCharacter(ustring[sep]), index);
        sep = (index > 0) ? ustring.find_last_of(operators, index) :
                            std::string::npos;
    }
    if (sep == 0) {
        // this should not happen
        // LCOV_EXCL_START
        sep = std::string::npos;
        // LCOV_EXCL_STOP
    }
    return sep;
}